

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall slang::driver::Driver::addLibraryFiles(Driver *this,string_view pattern)

{
  size_type __n;
  string_view libName;
  string_view local_38;
  
  local_38 = pattern;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_38,'=',0);
  if (__n == 0xffffffffffffffff) {
    libName = (string_view)ZEXT816(0);
  }
  else {
    libName = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_38,0,__n);
    local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_38,__n + 1,0xffffffffffffffff);
  }
  SourceLoader::addLibraryFiles(&this->sourceLoader,libName,local_38);
  return;
}

Assistant:

void Driver::addLibraryFiles(std::string_view pattern) {
    // Parse the pattern; there's an optional leading library name
    // followed by an equals sign. If not there, we use the default
    // library (represented by the empty string).
    std::string_view libraryName;
    auto index = pattern.find_first_of('=');
    if (index != std::string_view::npos) {
        libraryName = pattern.substr(0, index);
        pattern = pattern.substr(index + 1);
    }
    sourceLoader.addLibraryFiles(libraryName, pattern);
}